

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O2

bool __thiscall
r_exec::CSTController::inject_prediction
          (CSTController *this,Fact *prediction,double confidence,uint64_t time_to_live)

{
  uint64_t now;
  Group *host;
  _Mem *p_Var1;
  uint64_t res;
  View *this_00;
  float fVar2;
  
  now = (*Now)();
  host = HLPController::get_host(&this->super_HLPController);
  (*(host->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(host,2);
  fVar2 = (float)r_code::Atom::asFloat();
  if ((double)fVar2 < confidence) {
    p_Var1 = (_Mem *)r_code::Mem::Get();
    res = _Mem::get_goal_pred_success_res(p_Var1,host,now,time_to_live);
    this_00 = (View *)operator_new(0x100);
    View::View(this_00,SYNC_ONCE,now,confidence,res,(Code *)host,(Code *)host,(Code *)prediction);
    p_Var1 = (_Mem *)r_code::Mem::Get();
    _Mem::inject(p_Var1,this_00);
  }
  return (double)fVar2 < confidence;
}

Assistant:

bool CSTController::inject_prediction(Fact *prediction, double confidence, uint64_t time_to_live) const   // prediction: f->pred->f->target.
{
    uint64_t now = Now();
    Group *primary_host = get_host();
    float sln_thr = primary_host->code(GRP_SLN_THR).asFloat();

    if (confidence > sln_thr) { // do not inject if cfd is too low.
        int64_t resilience = _Mem::Get()->get_goal_pred_success_res(primary_host, now, time_to_live);
        View *view = new View(View::SYNC_ONCE, now, confidence, resilience, primary_host, primary_host, prediction); // SYNC_ONCE,res=resilience.
        _Mem::Get()->inject(view);
        return true;
    } else {
        return false;
    }
}